

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O2

SparseBufferProperties __thiscall Diligent::BufferVkImpl::GetSparseProperties(BufferVkImpl *this)

{
  VulkanLogicalDevice *this_00;
  uint uVar1;
  VkBuffer vkBuffer;
  SparseBufferProperties SVar2;
  VkMemoryRequirements MemReq;
  string local_30;
  
  if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[62]>
              (&local_30,
               (char (*) [62])"IBuffer::GetSparseProperties() must be used for sparse buffer");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x267);
    std::__cxx11::string::~string((string *)&local_30);
  }
  this_00 = (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  vkBuffer = GetVkBuffer(this);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)&local_30,this_00,vkBuffer);
  uVar1 = StaticCast<unsigned_int,unsigned_long>(&local_30._M_string_length);
  SVar2.BlockSize = uVar1;
  SVar2.AddressSpaceSize = (Uint64)local_30._M_dataplus._M_p;
  SVar2._12_4_ = 0;
  return SVar2;
}

Assistant:

SparseBufferProperties BufferVkImpl::GetSparseProperties() const
{
    DEV_CHECK_ERR(m_Desc.Usage == USAGE_SPARSE,
                  "IBuffer::GetSparseProperties() must be used for sparse buffer");

    VkMemoryRequirements MemReq = m_pDevice->GetLogicalDevice().GetBufferMemoryRequirements(GetVkBuffer());

    SparseBufferProperties Props{};
    Props.AddressSpaceSize = MemReq.size;
    Props.BlockSize        = StaticCast<Uint32>(MemReq.alignment);
    return Props;
}